

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_mov_vec_x86_64(TCGContext *tcg_ctx,TCGv_vec r,TCGv_vec a)

{
  uintptr_t o_1;
  
  if (r != a) {
    vec_gen_2_x86_64(tcg_ctx,INDEX_op_mov_vec,
                     (uint)(byte)((undefined1 *)((long)&tcg_ctx->pool_cur + 2))[(long)r],0,
                     (TCGArg)(r + (long)&tcg_ctx->pool_cur),(TCGArg)(a + (long)tcg_ctx));
    return;
  }
  return;
}

Assistant:

void tcg_gen_mov_vec(TCGContext *tcg_ctx, TCGv_vec r, TCGv_vec a)
{
    if (r != a) {
        vec_gen_op2(tcg_ctx, INDEX_op_mov_vec, 0, r, a);
    }
}